

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::OptionAlreadyAdded::OptionAlreadyAdded(OptionAlreadyAdded *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,name," is already added");
  OptionAlreadyAdded(this,&local_30,OptionAlreadyAdded);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

OptionAlreadyAdded(std::string name)
        : OptionAlreadyAdded(name + " is already added", ExitCodes::OptionAlreadyAdded) {}